

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

bool loadOtherMap(void)

{
  bool local_a;
  char local_9 [8];
  char playerChoice;
  
  local_9[0] = 'z';
  do {
    std::operator<<((ostream *)&std::cout,
                    "\nWould you like to add a map to the tournament (y / n) ? ");
    std::operator>>((istream *)&std::cin,local_9);
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,0x200);
    local_a = local_9[0] != 'y' && local_9[0] != 'n';
  } while (local_a);
  return local_9[0] == 'y';
}

Assistant:

static bool loadOtherMap() {
    char playerChoice = 'z';
    do {
        cout << "\nWould you like to add a map to the tournament (y / n) ? ";
        cin >> playerChoice;
        cin.clear();
        cin.ignore(512, '\n');
    } while (playerChoice != 'y' && playerChoice != 'n');
    return playerChoice == 'y';
}